

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYElement::addProperty(PLYElement *this,PLYProperty *p)

{
  pointer *ppPVar1;
  PLYProperty *__last;
  PLYProperty *__first;
  ulong uVar2;
  PLYProperty *__result;
  PLYProperty *pPVar3;
  allocator<gvr::(anonymous_namespace)::PLYProperty> *__alloc;
  ulong uVar4;
  ulong uVar5;
  
  __last = (this->list).
           super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (this->list).
                super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->list).
              super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)__last - (long)__first == 0x7fffffffffffffc0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar4 = (long)__last - (long)__first >> 6;
    uVar2 = 1;
    if (__last != __first) {
      uVar2 = uVar4;
    }
    uVar5 = uVar2 + uVar4;
    __alloc = (allocator<gvr::(anonymous_namespace)::PLYProperty> *)0x1ffffffffffffff;
    if (0x1fffffffffffffe < uVar5) {
      uVar5 = 0x1ffffffffffffff;
    }
    if (CARRY8(uVar2,uVar4)) {
      uVar5 = 0x1ffffffffffffff;
    }
    if (uVar5 == 0) {
      __result = (PLYProperty *)0x0;
    }
    else {
      __result = (PLYProperty *)operator_new(uVar5 << 6);
    }
    anon_unknown_3::PLYProperty::PLYProperty(__result + uVar4,p);
    pPVar3 = std::
             __uninitialized_move_if_noexcept_a<gvr::(anonymous_namespace)::PLYProperty*,gvr::(anonymous_namespace)::PLYProperty*,std::allocator<gvr::(anonymous_namespace)::PLYProperty>>
                       (__first,__last,__result,__alloc);
    pPVar3 = std::
             __uninitialized_move_if_noexcept_a<gvr::(anonymous_namespace)::PLYProperty*,gvr::(anonymous_namespace)::PLYProperty*,std::allocator<gvr::(anonymous_namespace)::PLYProperty>>
                       (__last,__last,pPVar3 + 1,__alloc);
    std::_Destroy<gvr::(anonymous_namespace)::PLYProperty*>(__first,__last);
    if (__first != (PLYProperty *)0x0) {
      operator_delete(__first);
    }
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar5;
  }
  else {
    anon_unknown_3::PLYProperty::PLYProperty(__last,p);
    ppPVar1 = &(this->list).
               super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  return;
}

Assistant:

void addProperty(const PLYProperty &p) { list.push_back(p); }